

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotations_t * opengv::relative_pose::sixpt(RelativeAdapterBase *adapter,Indices *indices)

{
  Indices *pIVar1;
  int iVar2;
  Indices *in_RDX;
  Indices *in_RSI;
  rotations_t *in_RDI;
  bearingVector_t f2;
  bearingVector_t f1;
  size_t i;
  Matrix<double,_6,_6,_0,_6,_6> L2;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  size_t numberCorrespondences;
  rotations_t *solutions;
  rotations_t *in_stack_00040a10;
  Matrix<double,_6,_6,_0,_6,_6> *in_stack_00040a18;
  Matrix<double,_6,_6,_0,_6,_6> *in_stack_00040a20;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  Indices *this;
  Indices *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb58;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb60;
  undefined1 local_448 [144];
  undefined1 local_3b8 [24];
  undefined1 local_3a0 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_358;
  undefined1 local_330 [24];
  undefined1 local_318 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2d0;
  ulong local_2a8;
  size_t local_50;
  Indices *local_40;
  
  local_40 = in_RSI;
  local_50 = Indices::size(in_RDX);
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)0xc83906);
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)0xc83913);
  for (local_2a8 = 0; local_2a8 < local_50; local_2a8 = local_2a8 + 1) {
    this = local_40;
    iVar2 = Indices::operator[](local_40,in_stack_fffffffffffffacc);
    (**(code **)(*(long *)this + 0x30))(local_318,this,(long)iVar2);
    this_00 = local_40;
    iVar2 = Indices::operator[](this,in_stack_fffffffffffffacc);
    (**(code **)(*(long *)this_00 + 0x10))(local_330,this_00,(long)iVar2);
    local_2d0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                           in_stack_fffffffffffffac0);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffffac0);
    pIVar1 = local_40;
    iVar2 = Indices::operator[](this,in_stack_fffffffffffffacc);
    (**(code **)(*(long *)pIVar1 + 0x40))(local_3a0,pIVar1,(long)iVar2);
    pIVar1 = local_40;
    iVar2 = Indices::operator[](this,in_stack_fffffffffffffacc);
    (**(code **)(*(long *)pIVar1 + 0x18))(local_3b8,pIVar1,(long)iVar2);
    local_358 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                           in_stack_fffffffffffffac0);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffffac0);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_00,(Index)this,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffac0);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_00,(Index)this,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffac0);
    pIVar1 = local_40;
    iVar2 = Indices::operator[](this,in_stack_fffffffffffffacc);
    (**(code **)(*(long *)pIVar1 + 0x28))(local_448,pIVar1,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_00,(Index)this,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffac0);
    pIVar1 = local_40;
    iVar2 = Indices::operator[](this,in_stack_fffffffffffffacc);
    (**(code **)(*(long *)pIVar1 + 0x38))(&stack0xfffffffffffffb58,pIVar1,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_00,(Index)this,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false> *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffac0);
  }
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xc83c3b);
  modules::sixpt_main(in_stack_00040a20,in_stack_00040a18,in_stack_00040a10);
  return in_RDI;
}

Assistant:

rotations_t sixpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 6);

  Eigen::Matrix<double,6,6> L1;
  Eigen::Matrix<double,6,6> L2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 =
        adapter.getCamRotation1(indices[i]) * adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 =
        adapter.getCamRotation2(indices[i]) * adapter.getBearingVector2(indices[i]);
        
    L1.block<3,1>(0,i) = f1;
    L2.block<3,1>(0,i) = f2;
    
    L1.block<3,1>(3,i) = f1.cross(adapter.getCamOffset1(indices[i]));
    L2.block<3,1>(3,i) = f2.cross(adapter.getCamOffset2(indices[i]));
  }

  rotations_t solutions;
  modules::sixpt_main( L1, L2, solutions );  
  return solutions;
}